

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::useUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,BaseUniformType type)

{
  int iVar1;
  float fVar2;
  float fVar3;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  
  switch(type) {
  case UB_FALSE:
  case UI_ZERO:
    local_1a8 = (undefined1  [8])((ulong)(uint)local_1a8._4_4_ << 0x20);
    goto LAB_006330ab;
  case UB_TRUE:
  case UI_ONE:
    local_1a8._0_4_ = 1.4013e-45;
    goto LAB_006330ab;
  case UB4_FALSE:
  case UV4_ZERO:
    fVar2 = 0.0;
    goto LAB_00633268;
  case UB4_TRUE:
  case UV4_ONE:
    fVar2 = 1.0;
    goto LAB_00633268;
  case UI_TWO:
    local_1a8._0_4_ = 2.8026e-45;
    goto LAB_006330ab;
  case UI_THREE:
    local_1a8._0_4_ = 4.2039e-45;
    goto LAB_006330ab;
  case UI_FOUR:
    local_1a8._0_4_ = 5.60519e-45;
    goto LAB_006330ab;
  case UI_FIVE:
    local_1a8._0_4_ = 7.00649e-45;
    goto LAB_006330ab;
  case UI_SIX:
    local_1a8._0_4_ = 8.40779e-45;
    goto LAB_006330ab;
  case UI_SEVEN:
    local_1a8._0_4_ = 9.80909e-45;
    goto LAB_006330ab;
  case UI_EIGHT:
    local_1a8._0_4_ = 1.12104e-44;
    goto LAB_006330ab;
  case UI_ONEHUNDREDONE:
    local_1a8._0_4_ = 1.41531e-43;
LAB_006330ab:
    addUniform<int>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(int *)local_1a8);
    return;
  case UI2_MINUS_ONE:
    local_1a8._0_4_ = -NAN;
    local_1a8._4_4_ = -NAN;
    goto LAB_0063311f;
  case UI2_ZERO:
    local_1a8._0_4_ = 0.0;
    local_1a8._4_4_ = 0.0;
    goto LAB_0063311f;
  case UI2_ONE:
    local_1a8._0_4_ = 1.4013e-45;
    local_1a8._4_4_ = 1.4013e-45;
    goto LAB_0063311f;
  case UI2_TWO:
    local_1a8 = (undefined1  [8])&DAT_200000002;
    goto LAB_0063311f;
  case UI2_THREE:
    local_1a8._0_4_ = 4.2039e-45;
    local_1a8._4_4_ = 4.2039e-45;
    goto LAB_0063311f;
  case UI2_FOUR:
    local_1a8._0_4_ = 5.60519e-45;
    local_1a8._4_4_ = 5.60519e-45;
    goto LAB_0063311f;
  case UI2_FIVE:
    local_1a8._0_4_ = 7.00649e-45;
    local_1a8._4_4_ = 7.00649e-45;
LAB_0063311f:
    addUniform<tcu::Vector<int,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(Vector<int,_2> *)local_1a8);
    return;
  case UI3_MINUS_ONE:
    iVar1 = -1;
    goto LAB_006331a0;
  case UI3_ZERO:
    iVar1 = 0;
    goto LAB_006331a0;
  case UI3_ONE:
    iVar1 = 1;
    goto LAB_006331a0;
  case UI3_TWO:
    iVar1 = 2;
    goto LAB_006331a0;
  case UI3_THREE:
    iVar1 = 3;
    goto LAB_006331a0;
  case UI3_FOUR:
    iVar1 = 4;
    goto LAB_006331a0;
  case UI3_FIVE:
    iVar1 = 5;
LAB_006331a0:
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_1a8,iVar1);
    addUniform<tcu::Vector<int,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(Vector<int,_3> *)local_1a8);
    return;
  case UI4_MINUS_ONE:
    iVar1 = -1;
    goto LAB_006330cd;
  case UI4_ZERO:
    iVar1 = 0;
    goto LAB_006330cd;
  case UI4_ONE:
    iVar1 = 1;
    goto LAB_006330cd;
  case UI4_TWO:
    iVar1 = 2;
    goto LAB_006330cd;
  case UI4_THREE:
    iVar1 = 3;
    goto LAB_006330cd;
  case UI4_FOUR:
    iVar1 = 4;
    goto LAB_006330cd;
  case UI4_FIVE:
    iVar1 = 5;
LAB_006330cd:
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_1a8,iVar1);
    addUniform<tcu::Vector<int,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(Vector<int,_4> *)local_1a8);
    return;
  case UF_ZERO:
    local_1a8 = (undefined1  [8])((ulong)(uint)local_1a8._4_4_ << 0x20);
    break;
  case UF_ONE:
    local_1a8._0_4_ = 1.0;
    break;
  case UF_TWO:
    local_1a8._0_4_ = 2.0;
    break;
  case UF_THREE:
    local_1a8._0_4_ = 3.0;
    break;
  case UF_FOUR:
    local_1a8._0_4_ = 4.0;
    break;
  case UF_FIVE:
    local_1a8._0_4_ = 5.0;
    break;
  case UF_SIX:
    local_1a8._0_4_ = 6.0;
    break;
  case UF_SEVEN:
    local_1a8._0_4_ = 7.0;
    break;
  case UF_EIGHT:
    local_1a8._0_4_ = 8.0;
    break;
  case UF_HALF:
    local_1a8._0_4_ = 0.5;
    break;
  case UF_THIRD:
    local_1a8._0_4_ = 0.33333334;
    break;
  case UF_FOURTH:
    local_1a8._0_4_ = 0.25;
    break;
  case UF_FIFTH:
    local_1a8._0_4_ = 0.2;
    break;
  case UF_SIXTH:
    local_1a8._0_4_ = 0.16666667;
    break;
  case UF_SEVENTH:
    local_1a8._0_4_ = 0.14285715;
    break;
  case UF_EIGHTH:
    local_1a8._0_4_ = 0.125;
    break;
  case UV2_MINUS_ONE:
    fVar2 = -1.0;
    fVar3 = -1.0;
    goto LAB_00633219;
  case UV2_ZERO:
    local_1a8._0_4_ = 0.0;
    local_1a8._4_4_ = 0.0;
    goto LAB_00633220;
  case UV2_ONE:
    fVar2 = 1.0;
    fVar3 = 1.0;
    goto LAB_00633219;
  case UV2_TWO:
    fVar2 = 2.0;
    fVar3 = 2.0;
    goto LAB_00633219;
  case UV2_THREE:
    fVar2 = 3.0;
    fVar3 = 3.0;
    goto LAB_00633219;
  case UV2_HALF:
    fVar2 = 0.5;
    fVar3 = 0.5;
LAB_00633219:
    local_1a8._4_4_ = fVar3;
    local_1a8._0_4_ = fVar2;
LAB_00633220:
    addUniform<tcu::Vector<float,2>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(Vector<float,_2> *)local_1a8)
    ;
    return;
  case UV3_MINUS_ONE:
    fVar2 = -1.0;
    goto LAB_00633157;
  case UV3_ZERO:
    fVar2 = 0.0;
    goto LAB_00633157;
  case UV3_ONE:
    fVar2 = 1.0;
    goto LAB_00633157;
  case UV3_TWO:
    fVar2 = 2.0;
    goto LAB_00633157;
  case UV3_THREE:
    fVar2 = 3.0;
    goto LAB_00633157;
  case UV3_HALF:
    fVar2 = 0.5;
LAB_00633157:
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_1a8,fVar2);
    addUniform<tcu::Vector<float,3>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(Vector<float,_3> *)local_1a8)
    ;
    return;
  case UV4_MINUS_ONE:
    fVar2 = -1.0;
    goto LAB_00633268;
  case UV4_TWO:
    fVar2 = 2.0;
    goto LAB_00633268;
  case UV4_THREE:
    fVar2 = 3.0;
    goto LAB_00633268;
  case UV4_HALF:
    fVar2 = 0.5;
LAB_00633268:
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1a8,fVar2);
LAB_0063327b:
    addUniform<tcu::Vector<float,4>>
              (this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(Vector<float,_4> *)local_1a8)
    ;
    return;
  case UV4_BLACK:
    local_1a8._0_4_ = 0.0;
    local_1a8._4_4_ = 0.0;
    fStack_1a0 = 0.0;
    goto LAB_00632eee;
  case UV4_GRAY:
    local_1a8._0_4_ = 0.5;
    local_1a8._4_4_ = 0.5;
    fStack_1a0 = 0.5;
    goto LAB_00632eee;
  case UV4_WHITE:
    local_1a8._0_4_ = 1.0;
    local_1a8._4_4_ = 1.0;
    fStack_1a0 = 1.0;
LAB_00632eee:
    fStack_19c = 1.0;
    goto LAB_0063327b;
  default:
    local_1a8 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1a0);
    std::operator<<((ostream *)&fStack_1a0,"Unknown Uniform type: ");
    std::ostream::operator<<((ostringstream *)&fStack_1a0,type);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1a0);
    return;
  }
  addUniform<float>(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,(float *)local_1a8);
  return;
}

Assistant:

void ShaderRenderCaseInstance::useUniform (deUint32 bindingLocation, BaseUniformType type)
{
	#define UNIFORM_CASE(type, value) case type: addUniform(bindingLocation, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, value); break

	switch(type)
	{
		// Bool
		UNIFORM_CASE(UB_FALSE,	0);
		UNIFORM_CASE(UB_TRUE,	1);

		// BVec4
		UNIFORM_CASE(UB4_FALSE,	tcu::Vec4(0));
		UNIFORM_CASE(UB4_TRUE,	tcu::Vec4(1));

		// Integer
		UNIFORM_CASE(UI_ZERO,	0);
		UNIFORM_CASE(UI_ONE,	1);
		UNIFORM_CASE(UI_TWO,	2);
		UNIFORM_CASE(UI_THREE,	3);
		UNIFORM_CASE(UI_FOUR,	4);
		UNIFORM_CASE(UI_FIVE,	5);
		UNIFORM_CASE(UI_SIX,	6);
		UNIFORM_CASE(UI_SEVEN,	7);
		UNIFORM_CASE(UI_EIGHT,	8);
		UNIFORM_CASE(UI_ONEHUNDREDONE, 101);

		// IVec2
		UNIFORM_CASE(UI2_MINUS_ONE,	tcu::IVec2(-1));
		UNIFORM_CASE(UI2_ZERO,		tcu::IVec2(0));
		UNIFORM_CASE(UI2_ONE,		tcu::IVec2(1));
		UNIFORM_CASE(UI2_TWO,		tcu::IVec2(2));
		UNIFORM_CASE(UI2_THREE,		tcu::IVec2(3));
		UNIFORM_CASE(UI2_FOUR,		tcu::IVec2(4));
		UNIFORM_CASE(UI2_FIVE,		tcu::IVec2(5));

		// IVec3
		UNIFORM_CASE(UI3_MINUS_ONE,	tcu::IVec3(-1));
		UNIFORM_CASE(UI3_ZERO,		tcu::IVec3(0));
		UNIFORM_CASE(UI3_ONE,		tcu::IVec3(1));
		UNIFORM_CASE(UI3_TWO,		tcu::IVec3(2));
		UNIFORM_CASE(UI3_THREE,		tcu::IVec3(3));
		UNIFORM_CASE(UI3_FOUR,		tcu::IVec3(4));
		UNIFORM_CASE(UI3_FIVE,		tcu::IVec3(5));

		// IVec4
		UNIFORM_CASE(UI4_MINUS_ONE, tcu::IVec4(-1));
		UNIFORM_CASE(UI4_ZERO,		tcu::IVec4(0));
		UNIFORM_CASE(UI4_ONE,		tcu::IVec4(1));
		UNIFORM_CASE(UI4_TWO,		tcu::IVec4(2));
		UNIFORM_CASE(UI4_THREE,		tcu::IVec4(3));
		UNIFORM_CASE(UI4_FOUR,		tcu::IVec4(4));
		UNIFORM_CASE(UI4_FIVE,		tcu::IVec4(5));

		// Float
		UNIFORM_CASE(UF_ZERO,		0.0f);
		UNIFORM_CASE(UF_ONE,		1.0f);
		UNIFORM_CASE(UF_TWO,		2.0f);
		UNIFORM_CASE(UF_THREE,		3.0f);
		UNIFORM_CASE(UF_FOUR,		4.0f);
		UNIFORM_CASE(UF_FIVE,		5.0f);
		UNIFORM_CASE(UF_SIX,		6.0f);
		UNIFORM_CASE(UF_SEVEN,		7.0f);
		UNIFORM_CASE(UF_EIGHT,		8.0f);

		UNIFORM_CASE(UF_HALF,		1.0f / 2.0f);
		UNIFORM_CASE(UF_THIRD,		1.0f / 3.0f);
		UNIFORM_CASE(UF_FOURTH,		1.0f / 4.0f);
		UNIFORM_CASE(UF_FIFTH,		1.0f / 5.0f);
		UNIFORM_CASE(UF_SIXTH,		1.0f / 6.0f);
		UNIFORM_CASE(UF_SEVENTH,	1.0f / 7.0f);
		UNIFORM_CASE(UF_EIGHTH,		1.0f / 8.0f);

		// Vec2
		UNIFORM_CASE(UV2_MINUS_ONE,	tcu::Vec2(-1.0f));
		UNIFORM_CASE(UV2_ZERO,		tcu::Vec2(0.0f));
		UNIFORM_CASE(UV2_ONE,		tcu::Vec2(1.0f));
		UNIFORM_CASE(UV2_TWO,		tcu::Vec2(2.0f));
		UNIFORM_CASE(UV2_THREE,		tcu::Vec2(3.0f));

		UNIFORM_CASE(UV2_HALF,		tcu::Vec2(1.0f / 2.0f));

		// Vec3
		UNIFORM_CASE(UV3_MINUS_ONE,	tcu::Vec3(-1.0f));
		UNIFORM_CASE(UV3_ZERO,		tcu::Vec3(0.0f));
		UNIFORM_CASE(UV3_ONE,		tcu::Vec3(1.0f));
		UNIFORM_CASE(UV3_TWO,		tcu::Vec3(2.0f));
		UNIFORM_CASE(UV3_THREE,		tcu::Vec3(3.0f));

		UNIFORM_CASE(UV3_HALF,		tcu::Vec3(1.0f / 2.0f));

		// Vec4
		UNIFORM_CASE(UV4_MINUS_ONE,	tcu::Vec4(-1.0f));
		UNIFORM_CASE(UV4_ZERO,		tcu::Vec4(0.0f));
		UNIFORM_CASE(UV4_ONE,		tcu::Vec4(1.0f));
		UNIFORM_CASE(UV4_TWO,		tcu::Vec4(2.0f));
		UNIFORM_CASE(UV4_THREE,		tcu::Vec4(3.0f));

		UNIFORM_CASE(UV4_HALF,		tcu::Vec4(1.0f / 2.0f));

		UNIFORM_CASE(UV4_BLACK,		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		UNIFORM_CASE(UV4_GRAY,		tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));
		UNIFORM_CASE(UV4_WHITE,		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

		default:
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unknown Uniform type: " << type << tcu::TestLog::EndMessage;
			break;
	}

	#undef UNIFORM_CASE
}